

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceMatrixDecomposition::unpackPrePairData
          (ForceMatrixDecomposition *this,InteractionData *idat,int atom1,int atom2)

{
  pointer pdVar1;
  
  if (((this->super_ForceDecomposition).atomStorageLayout_ & 0x80) != 0) {
    pdVar1 = (((this->super_ForceDecomposition).snap_)->atomData).density.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar1[atom1] = idat->rho1;
    pdVar1[atom2] = idat->rho2;
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::unpackPrePairData(InteractionData& idat,
                                                   int atom1, int atom2) {
#ifdef IS_MPI

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      atomRowData.density[atom1] = idat.rho1;
      atomColData.density[atom2] = idat.rho2;
    }

#else

    if (atomStorageLayout_ & DataStorage::dslDensity) {
      snap_->atomData.density[atom1] = idat.rho1;
      snap_->atomData.density[atom2] = idat.rho2;
    }

#endif
  }